

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_socket.hpp
# Opt level: O2

int __thiscall
asio::basic_socket<asio::ip::udp,_asio::any_io_executor>::close
          (basic_socket<asio::ip::udp,_asio::any_io_executor> *this,int __fd)

{
  int extraout_EAX;
  error_code ec;
  error_code local_20;
  
  local_20._M_value = 0;
  local_20._M_cat = (error_category *)std::_V2::system_category();
  detail::reactive_socket_service_base::close
            (&((this->impl_).service_)->super_reactive_socket_service_base,(int)this + 8);
  detail::throw_error(&local_20,"close");
  return extraout_EAX;
}

Assistant:

void close()
  {
    asio::error_code ec;
    impl_.get_service().close(impl_.get_implementation(), ec);
    asio::detail::throw_error(ec, "close");
  }